

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

Point3f __thiscall
pbrt::AnimatedTransform::operator()(AnimatedTransform *this,Point3f *p,Float time)

{
  Tuple3<pbrt::Point3,_float> TVar1;
  long in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  Point3<float> PVar6;
  Transform t;
  Point3<float> *in_stack_000000b8;
  Transform *in_stack_000000c0;
  Float in_stack_0000024c;
  AnimatedTransform *in_stack_00000250;
  undefined8 local_c;
  undefined4 local_4;
  undefined1 auVar5 [56];
  
  auVar5 = in_ZMM0._8_56_;
  if (((*(byte *)(in_RDI + 0x108) & 1) == 0) ||
     (auVar5 = (undefined1  [56])0x0, in_ZMM0._0_4_ <= *(float *)(in_RDI + 0x100))) {
    PVar6 = Transform::operator()(in_stack_000000c0,in_stack_000000b8);
    local_4 = PVar6.super_Tuple3<pbrt::Point3,_float>.z;
    auVar2._0_8_ = PVar6.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar2._8_56_ = auVar5;
    local_c = vmovlpd_avx(auVar2._0_16_);
  }
  else {
    auVar5 = (undefined1  [56])0x0;
    if (in_ZMM0._0_4_ < *(float *)(in_RDI + 0x104)) {
      auVar5 = (undefined1  [56])0x0;
      Interpolate(in_stack_00000250,in_stack_0000024c);
      PVar6 = Transform::operator()(in_stack_000000c0,in_stack_000000b8);
      local_4 = PVar6.super_Tuple3<pbrt::Point3,_float>.z;
      auVar4._0_8_ = PVar6.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar4._8_56_ = auVar5;
      local_c = vmovlpd_avx(auVar4._0_16_);
    }
    else {
      PVar6 = Transform::operator()(in_stack_000000c0,in_stack_000000b8);
      local_4 = PVar6.super_Tuple3<pbrt::Point3,_float>.z;
      auVar3._0_8_ = PVar6.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar3._8_56_ = auVar5;
      local_c = vmovlpd_avx(auVar3._0_16_);
    }
  }
  TVar1.z = local_4;
  TVar1.x = (float)(undefined4)local_c;
  TVar1.y = (float)local_c._4_4_;
  return (Point3f)TVar1;
}

Assistant:

Point3f AnimatedTransform::operator()(const Point3f &p, Float time) const {
    if (!actuallyAnimated || time <= startTime)
        return startTransform(p);
    else if (time >= endTime)
        return endTransform(p);
    Transform t = Interpolate(time);
    return t(p);
}